

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseFunctionDecls(Parser *this,ScannedTopLevelItem *item)

{
  pool_ptr<soul::Module> *this_00;
  pointer pUVar1;
  Module *pMVar2;
  Function *f;
  size_t i;
  ulong index;
  UTF8Reader local_30;
  
  prepareToRescan(this,item);
  this_00 = &this->module;
  pMVar2 = pool_ptr<soul::Module>::operator->(this_00);
  if ((pMVar2->functions).functions.numActive !=
      (long)(item->functionParamCode).
            super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(item->functionParamCode).
            super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    throwInternalCompilerError
              ("module->functions.size() == item.functionParamCode.size()","parseFunctionDecls",0xe7
              );
  }
  pMVar2 = pool_ptr<soul::Module>::operator->(this_00);
  if ((pMVar2->functions).functions.numActive ==
      (long)(item->functionBodyCode).
            super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(item->functionBodyCode).
            super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    for (index = 0;
        pUVar1 = (item->functionParamCode).
                 super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                 super__Vector_impl_data._M_start,
        index < (ulong)((long)(item->functionParamCode).
                              super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 3);
        index = index + 1) {
      local_30.data = pUVar1[index].data;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      resetPosition(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,&local_30);
      pMVar2 = pool_ptr<soul::Module>::operator->(this_00);
      f = Module::Functions::at(&pMVar2->functions,index);
      parseFunctionParams(this,f);
    }
    this_00->object = (Module *)0x0;
    return;
  }
  throwInternalCompilerError
            ("module->functions.size() == item.functionBodyCode.size()","parseFunctionDecls",0xe8);
}

Assistant:

void parseFunctionDecls (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);
        SOUL_ASSERT (module->functions.size() == item.functionParamCode.size());
        SOUL_ASSERT (module->functions.size() == item.functionBodyCode.size());

        for (size_t i = 0; i < item.functionParamCode.size(); ++i)
        {
            resetPosition (item.functionParamCode[i]);
            parseFunctionParams (module->functions.at (i));
        }

        module.reset();
    }